

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

void __thiscall
cmQtAutoGeneratorMocUic::WorkerSwapJob(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  JobT *pJVar1;
  _Elt_pointer puVar2;
  JobT *pJVar3;
  size_t in_RCX;
  void *__buf;
  int __fd;
  int in_R8D;
  unique_lock<std::mutex> jobsLock;
  unique_lock<std::mutex> local_30;
  JobHandleT *pJVar4;
  
  pJVar1 = (jobHandle->_M_t).
           super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
           .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
  if (pJVar1 == (JobT *)0x0) {
    local_30._M_device = &this->JobsMutex_;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
  }
  else {
    (jobHandle->_M_t).
    super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl = (JobT *)0x0;
    pJVar4 = jobHandle;
    (*pJVar1->_vptr_JobT[1])();
    __fd = (int)pJVar4;
    local_30._M_device = &this->JobsMutex_;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    this->JobsRemain_ = this->JobsRemain_ - 1;
    if (this->JobsRemain_ == 0) {
      ::cm::uv_async_ptr::send(&(this->super_cmQtAutoGenerator).UVRequest_,__fd,__buf,in_RCX,in_R8D)
      ;
    }
  }
  if (this->JobThreadsAbort_ == false) {
    do {
      if ((this->JobQueue_).
          super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (this->JobQueue_).
          super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      std::condition_variable::wait((unique_lock *)&this->JobsConditionRead_);
    } while (this->JobThreadsAbort_ != true);
  }
  if ((this->JobThreadsAbort_ == false) &&
     (puVar2 = (this->JobQueue_).
               super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (this->JobQueue_).
     super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
     ._M_impl.super__Deque_impl_data._M_finish._M_cur != puVar2)) {
    pJVar1 = (puVar2->_M_t).
             super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
    (puVar2->_M_t).
    super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl = (JobT *)0x0;
    pJVar3 = (jobHandle->_M_t).
             super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
    (jobHandle->_M_t).
    super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
    .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl = pJVar1;
    if (pJVar3 != (JobT *)0x0) {
      (*pJVar3->_vptr_JobT[1])();
    }
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
    ::pop_front(&this->JobQueue_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::WorkerSwapJob(JobHandleT& jobHandle)
{
  bool const jobProcessed(jobHandle);
  if (jobProcessed) {
    jobHandle.reset();
  }
  {
    std::unique_lock<std::mutex> jobsLock(JobsMutex_);
    // Reduce the remaining job count and notify the libuv loop
    // when all jobs are done
    if (jobProcessed) {
      --JobsRemain_;
      if (JobsRemain_ == 0) {
        UVRequest().send();
      }
    }
    // Wait for new jobs
    while (!JobThreadsAbort_ && JobQueue_.empty()) {
      JobsConditionRead_.wait(jobsLock);
    }
    // Try to pick up a new job handle
    if (!JobThreadsAbort_ && !JobQueue_.empty()) {
      jobHandle = std::move(JobQueue_.front());
      JobQueue_.pop_front();
    }
  }
}